

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_make_huffman_code
               (uint num_syms,uint max_codeword_len,u32 *freqs,u8 *lens,u32 *codewords)

{
  u8 *in_RCX;
  uint in_ESI;
  uint in_EDI;
  u32 *in_R8;
  uint len_counts [16];
  uint nonzero_idx;
  uint sym;
  uint num_used_syms;
  u32 *A;
  u32 *in_stack_00000428;
  u8 *in_stack_00000430;
  u32 *in_stack_00000438;
  uint in_stack_00000444;
  uint local_80;
  uint local_7c;
  uint local_78 [19];
  uint local_2c;
  u32 *local_28;
  u32 *local_20;
  u8 *local_18;
  uint local_8;
  uint local_4;
  
  local_28 = in_R8;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  local_2c = sort_symbols(in_stack_00000444,in_stack_00000438,in_stack_00000430,in_stack_00000428);
  if (local_2c < 2) {
    if (local_2c == 0) {
      local_7c = 0;
    }
    else {
      local_7c = *local_28 & 0x3ff;
    }
    if (local_7c == 0) {
      local_80 = 1;
    }
    else {
      local_80 = local_7c;
    }
    *local_20 = 0;
    *local_18 = '\x01';
    local_20[local_80] = 1;
    local_18[local_80] = '\x01';
  }
  else {
    build_tree(local_28,local_2c);
    compute_length_counts(local_28,local_2c - 2,local_78,local_8);
    gen_codewords(local_28,local_18,local_78,local_8,local_4);
  }
  return;
}

Assistant:

static void
deflate_make_huffman_code(unsigned num_syms, unsigned max_codeword_len,
			  const u32 freqs[], u8 lens[], u32 codewords[])
{
	u32 *A = codewords;
	unsigned num_used_syms;

	STATIC_ASSERT(DEFLATE_MAX_NUM_SYMS <= 1 << NUM_SYMBOL_BITS);
	STATIC_ASSERT(MAX_BLOCK_LENGTH <= ((u32)1 << NUM_FREQ_BITS) - 1);

	/*
	 * We begin by sorting the symbols primarily by frequency and
	 * secondarily by symbol value.  As an optimization, the array used for
	 * this purpose ('A') shares storage with the space in which we will
	 * eventually return the codewords.
	 */
	num_used_syms = sort_symbols(num_syms, freqs, lens, A);
	/*
	 * 'num_used_syms' is the number of symbols with nonzero frequency.
	 * This may be less than @num_syms.  'num_used_syms' is also the number
	 * of entries in 'A' that are valid.  Each entry consists of a distinct
	 * symbol and a nonzero frequency packed into a 32-bit integer.
	 */

	/*
	 * A complete Huffman code must contain at least 2 codewords.  Yet, it's
	 * possible that fewer than 2 symbols were used.  When this happens,
	 * it's usually for the offset code (0-1 symbols used).  But it's also
	 * theoretically possible for the litlen and pre codes (1 symbol used).
	 *
	 * The DEFLATE RFC explicitly allows the offset code to contain just 1
	 * codeword, or even be completely empty.  But it's silent about the
	 * other codes.  It also doesn't say whether, in the 1-codeword case,
	 * the codeword (which it says must be 1 bit) is '0' or '1'.
	 *
	 * In any case, some DEFLATE decompressors reject these cases.  zlib
	 * generally allows them, but it does reject precodes that have just 1
	 * codeword.  More problematically, zlib v1.2.1 and earlier rejected
	 * empty offset codes, and this behavior can also be seen in Windows
	 * Explorer's ZIP unpacker (supposedly even still in Windows 11).
	 *
	 * Other DEFLATE compressors, including zlib, always send at least 2
	 * codewords in order to make a complete Huffman code.  Therefore, this
	 * is a case where practice does not entirely match the specification.
	 * We follow practice by generating 2 codewords of length 1: codeword
	 * '0' for symbol 0, and codeword '1' for another symbol -- the used
	 * symbol if it exists and is not symbol 0, otherwise symbol 1.  This
	 * does worsen the compression ratio by having to send an unnecessary
	 * offset codeword length.  But this only affects rare cases such as
	 * blocks containing all literals, and it only makes a tiny difference.
	 */
	if (unlikely(num_used_syms < 2)) {
		unsigned sym = num_used_syms ? (A[0] & SYMBOL_MASK) : 0;
		unsigned nonzero_idx = sym ? sym : 1;

		codewords[0] = 0;
		lens[0] = 1;
		codewords[nonzero_idx] = 1;
		lens[nonzero_idx] = 1;
		return;
	}

	/*
	 * Build a stripped-down version of the Huffman tree, sharing the array
	 * 'A' with the symbol values.  Then extract length counts from the tree
	 * and use them to generate the final codewords.
	 */

	build_tree(A, num_used_syms);

	{
		unsigned len_counts[DEFLATE_MAX_CODEWORD_LEN + 1];

		compute_length_counts(A, num_used_syms - 2,
				      len_counts, max_codeword_len);

		gen_codewords(A, lens, len_counts, max_codeword_len, num_syms);
	}
}